

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall gl4cts::GPUShaderFP64Test4::verifyUniformValues(GPUShaderFP64Test4 *this)

{
  uint uVar1;
  _stage_data *p_Var2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  float fVar9;
  double dVar10;
  uint local_a04;
  byte local_959;
  MessageBuilder local_940;
  MessageBuilder local_7c0;
  uint local_640;
  uint local_63c;
  uint rounded_uniform_value_uint;
  int rounded_uniform_value_sint;
  MessageBuilder local_4b8;
  uint local_334 [2];
  uint n_component;
  float epsilon;
  bool can_continue;
  double *uniform_value;
  undefined4 *puStack_318;
  GLint uniform_location;
  uniform_value_pair *current_uv_pair;
  uint n_pair;
  uint local_300;
  uint local_2fc;
  uint n_pairs;
  uint n_components_used;
  uniform_value_pair *current_uv_pairs;
  uint local_2e8;
  uint n_type;
  uint returned_uint_data [4];
  int returned_int_data [4];
  float returned_float_data [4];
  double returned_double_data [4];
  double *local_290;
  double *local_288;
  double *local_280;
  double *local_278;
  double *local_270;
  undefined1 local_268 [8];
  uniform_value_pair dvec4_uniforms [5];
  double *local_210;
  double *local_208;
  double *local_200;
  double *local_1f8;
  double *local_1f0;
  undefined1 local_1e8 [8];
  uniform_value_pair dvec3_uniforms [5];
  double *local_190;
  double *local_188;
  double *local_180;
  double *local_178;
  double *local_170;
  undefined1 local_168 [8];
  uniform_value_pair dvec2_uniforms [5];
  _data *local_110;
  _stage_data *local_108;
  double *local_100;
  double *local_f8;
  _data *local_f0;
  undefined1 local_e8 [8];
  uniform_value_pair double_uniforms [5];
  _stage_data *stage_ptr;
  _stage_data **pp_Stack_80;
  uint n_stage;
  _stage_data **stage_data;
  uint n_stages;
  GLuint po_id;
  uint n_program;
  uint n_programs;
  GLuint programs [2];
  uint n_noncs_stages;
  uint n_cs_stages;
  _stage_data *noncs_stages [5];
  _stage_data *local_28;
  _stage_data *cs_stages [1];
  bool result;
  Functions *gl;
  GPUShaderFP64Test4 *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  cs_stages[0]._7_1_ = 1;
  local_28 = &this->m_data_cs;
  _n_noncs_stages = &this->m_data_fs;
  noncs_stages[0] = &this->m_data_gs;
  noncs_stages[1] = &this->m_data_tc;
  noncs_stages[2] = &this->m_data_te;
  noncs_stages[3] = &this->m_data_vs;
  programs[1] = 1;
  programs[0] = 5;
  n_program = this->m_po_noncs_id;
  n_programs = this->m_po_cs_id;
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
  for (n_stages = 0; n_stages < 2; n_stages = n_stages + 1) {
    uVar1 = (&n_program)[n_stages];
    if (uVar1 == this->m_po_cs_id) {
      stage_data._0_4_ = 1;
      pp_Stack_80 = &local_28;
    }
    else {
      stage_data._0_4_ = 5;
      pp_Stack_80 = (_stage_data **)&n_noncs_stages;
    }
    if (uVar1 != 0) {
      for (stage_ptr._4_4_ = 0; stage_ptr._4_4_ < (uint)stage_data;
          stage_ptr._4_4_ = stage_ptr._4_4_ + 1) {
        p_Var2 = pp_Stack_80[stage_ptr._4_4_];
        local_f0 = &p_Var2->uniforms;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)local_e8,&(p_Var2->uniforms).uniform_location_double,
                   (double **)&local_f0);
        local_f8 = (p_Var2->uniforms).uniform_double_arr;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)&double_uniforms[0].second,
                   (p_Var2->uniforms).uniform_location_double_arr,&local_f8);
        local_100 = (p_Var2->uniforms).uniform_double_arr + 1;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)&double_uniforms[1].second,
                   (p_Var2->uniforms).uniform_location_double_arr + 1,&local_100);
        local_108 = p_Var2;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)&double_uniforms[2].second,
                   &p_Var2->uniform_structure_arrays[0].uniform_location_double,
                   (double **)&local_108);
        local_110 = p_Var2->uniform_structure_arrays + 1;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)&double_uniforms[3].second,
                   &p_Var2->uniform_structure_arrays[1].uniform_location_double,
                   (double **)&local_110);
        local_170 = (p_Var2->uniforms).uniform_dvec2;
        std::pair<int,_double_*>::pair<int_&,_true>
                  ((pair<int,_double_*> *)local_168,&(p_Var2->uniforms).uniform_location_dvec2,
                   &local_170);
        local_178 = (p_Var2->uniforms).uniform_dvec2_arr;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)&dvec2_uniforms[0].second,
                   (p_Var2->uniforms).uniform_location_dvec2_arr,&local_178);
        local_180 = (p_Var2->uniforms).uniform_dvec2_arr + 2;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)&dvec2_uniforms[1].second,
                   (p_Var2->uniforms).uniform_location_dvec2_arr + 1,&local_180);
        local_188 = p_Var2->uniform_structure_arrays[0].uniform_dvec2;
        std::pair<int,_double_*>::pair<int_&,_true>
                  ((pair<int,_double_*> *)&dvec2_uniforms[2].second,
                   &p_Var2->uniform_structure_arrays[0].uniform_location_dvec2,&local_188);
        local_190 = p_Var2->uniform_structure_arrays[1].uniform_dvec2;
        std::pair<int,_double_*>::pair<int_&,_true>
                  ((pair<int,_double_*> *)&dvec2_uniforms[3].second,
                   &p_Var2->uniform_structure_arrays[1].uniform_location_dvec2,&local_190);
        local_1f0 = (p_Var2->uniforms).uniform_dvec3;
        std::pair<int,_double_*>::pair<int_&,_true>
                  ((pair<int,_double_*> *)local_1e8,&(p_Var2->uniforms).uniform_location_dvec3,
                   &local_1f0);
        local_1f8 = (p_Var2->uniforms).uniform_dvec3_arr;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)&dvec3_uniforms[0].second,
                   (p_Var2->uniforms).uniform_location_dvec3_arr,&local_1f8);
        local_200 = (p_Var2->uniforms).uniform_dvec3_arr + 3;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)&dvec3_uniforms[1].second,
                   (p_Var2->uniforms).uniform_location_dvec3_arr + 1,&local_200);
        local_208 = p_Var2->uniform_structure_arrays[0].uniform_dvec3;
        std::pair<int,_double_*>::pair<int_&,_true>
                  ((pair<int,_double_*> *)&dvec3_uniforms[2].second,
                   &p_Var2->uniform_structure_arrays[0].uniform_location_dvec3,&local_208);
        local_210 = p_Var2->uniform_structure_arrays[1].uniform_dvec3;
        std::pair<int,_double_*>::pair<int_&,_true>
                  ((pair<int,_double_*> *)&dvec3_uniforms[3].second,
                   &p_Var2->uniform_structure_arrays[1].uniform_location_dvec3,&local_210);
        local_270 = (p_Var2->uniforms).uniform_dvec4;
        std::pair<int,_double_*>::pair<int_&,_true>
                  ((pair<int,_double_*> *)local_268,&(p_Var2->uniforms).uniform_location_dvec4,
                   &local_270);
        local_278 = (p_Var2->uniforms).uniform_dvec4_arr;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)&dvec4_uniforms[0].second,
                   (p_Var2->uniforms).uniform_location_dvec4_arr,&local_278);
        local_280 = (p_Var2->uniforms).uniform_dvec4_arr + 4;
        std::pair<int,_double_*>::pair<int_&,_double_*,_true>
                  ((pair<int,_double_*> *)&dvec4_uniforms[1].second,
                   (p_Var2->uniforms).uniform_location_dvec4_arr + 1,&local_280);
        local_288 = p_Var2->uniform_structure_arrays[0].uniform_dvec4;
        std::pair<int,_double_*>::pair<int_&,_true>
                  ((pair<int,_double_*> *)&dvec4_uniforms[2].second,
                   &p_Var2->uniform_structure_arrays[0].uniform_location_dvec4,&local_288);
        local_290 = p_Var2->uniform_structure_arrays[1].uniform_dvec4;
        std::pair<int,_double_*>::pair<int_&,_true>
                  ((pair<int,_double_*> *)&dvec4_uniforms[3].second,
                   &p_Var2->uniform_structure_arrays[1].uniform_location_dvec4,&local_290);
        for (current_uv_pairs._4_4_ = 0; current_uv_pairs._4_4_ < 4;
            current_uv_pairs._4_4_ = current_uv_pairs._4_4_ + 1) {
          _n_pairs = (undefined1 *)0x0;
          local_2fc = current_uv_pairs._4_4_ + 1;
          local_300 = 0;
          switch(current_uv_pairs._4_4_) {
          case 0:
            _n_pairs = local_e8;
            break;
          case 1:
            _n_pairs = local_168;
            break;
          case 2:
            _n_pairs = local_1e8;
            break;
          case 3:
            _n_pairs = local_268;
            break;
          default:
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Invalid type index requested",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                       ,0x1bb2);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          local_300 = 5;
          for (current_uv_pair._0_4_ = 0; (uint)current_uv_pair < local_300;
              current_uv_pair._0_4_ = (uint)current_uv_pair + 1) {
            puStack_318 = (undefined4 *)(_n_pairs + (ulong)(uint)current_uv_pair * 0x10);
            uniform_value._4_4_ = *puStack_318;
            _epsilon = *(long *)(puStack_318 + 2);
            (**(code **)(lVar6 + 0xb58))(uVar1,uniform_value._4_4_,returned_float_data + 2);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glGetUniformdv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1bbe);
            (**(code **)(lVar6 + 0xb60))(uVar1,uniform_value._4_4_,returned_int_data + 2);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glGetUniformfv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1bc1);
            (**(code **)(lVar6 + 0xb68))(uVar1,uniform_value._4_4_,returned_uint_data + 2);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glGetUniformiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1bc4);
            (**(code **)(lVar6 + 0xb70))(uVar1,uniform_value._4_4_,&local_2e8);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glGetUniformuiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x1bc7);
            n_component._3_1_ = 1;
            local_334[1] = 0x3727c5ac;
            local_334[0] = 0;
            while( true ) {
              local_959 = 0;
              if (local_334[0] < local_2fc) {
                local_959 = n_component._3_1_;
              }
              if ((local_959 & 1) == 0) break;
              dVar10 = de::abs<double>(returned_double_data[(ulong)local_334[0] - 1] -
                                       *(double *)(_epsilon + (ulong)local_334[0] * 8));
              if (9.999999747378752e-06 < dVar10) {
                pTVar7 = tcu::TestContext::getLog
                                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_4b8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (&local_4b8,
                                    (char (*) [74])
                                    "Invalid uniform value reported by glGetUniformdv() for uniform location ["
                                   );
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&uniform_value + 4));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])"] and component [");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_334);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])"]: retrieved:[");
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (pMVar8,returned_double_data + ((ulong)local_334[0] - 1));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [14])"], expected:[");
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (pMVar8,(double *)(_epsilon + (ulong)local_334[0] * 8));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29dc08e);
                tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_4b8);
                cs_stages[0]._7_1_ = 0;
              }
              dVar10 = de::abs<double>((double)(float)returned_int_data[(ulong)local_334[0] + 2] -
                                       *(double *)(_epsilon + (ulong)local_334[0] * 8));
              if (9.999999747378752e-06 < dVar10) {
                pTVar7 = tcu::TestContext::getLog
                                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          ((MessageBuilder *)&rounded_uniform_value_uint,pTVar7,
                           (BeginMessageToken *)&tcu::TestLog::Message);
                pMVar8 = tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)&rounded_uniform_value_uint,
                                    (char (*) [74])
                                    "Invalid uniform value reported by glGetUniformfv() for uniform location ["
                                   );
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&uniform_value + 4));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])"] and component [");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_334);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])"]: retrieved:[");
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (pMVar8,(float *)(returned_int_data + (ulong)local_334[0] + 2));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [14])"], expected:[");
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (pMVar8,(double *)(_epsilon + (ulong)local_334[0] * 8));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29dc08e);
                tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&rounded_uniform_value_uint);
                cs_stages[0]._7_1_ = 0;
              }
              fVar9 = deFloatRound((float)*(double *)(_epsilon + (ulong)local_334[0] * 8));
              local_63c = (uint)fVar9;
              if (*(double *)(_epsilon + (ulong)local_334[0] * 8) <= 0.0) {
                local_a04 = 0;
              }
              else {
                fVar9 = deFloatRound((float)*(double *)(_epsilon + (ulong)local_334[0] * 8));
                local_a04 = (uint)(long)fVar9;
              }
              local_640 = local_a04;
              if (returned_uint_data[(ulong)local_334[0] + 2] != local_63c) {
                pTVar7 = tcu::TestContext::getLog
                                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_7c0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (&local_7c0,
                                    (char (*) [74])
                                    "Invalid uniform value reported by glGetUniformiv() for uniform location ["
                                   );
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&uniform_value + 4));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])"] and component [");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_334);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])"]: retrieved:[");
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (pMVar8,(int *)(returned_uint_data + (ulong)local_334[0] + 2));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [14])"], expected:[");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&local_63c);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29dc08e);
                tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_7c0);
                cs_stages[0]._7_1_ = 0;
              }
              if ((&local_2e8)[local_334[0]] != local_640) {
                pTVar7 = tcu::TestContext::getLog
                                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_940,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar8 = tcu::MessageBuilder::operator<<
                                   (&local_940,
                                    (char (*) [75])
                                    "Invalid uniform value reported by glGetUniformuiv() for uniform location ["
                                   );
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&uniform_value + 4));
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])"] and component [");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_334);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])"]: retrieved:[");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_2e8 + local_334[0]);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [14])"], expected:[");
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_640);
                pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29dc08e);
                tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_940);
                cs_stages[0]._7_1_ = 0;
              }
              local_334[0] = local_334[0] + 1;
            }
          }
        }
      }
    }
  }
  return (bool)(cs_stages[0]._7_1_ & 1);
}

Assistant:

bool GPUShaderFP64Test4::verifyUniformValues()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Iterate through all programs */
	_stage_data*	   cs_stages[]	= { &m_data_cs };
	_stage_data*	   noncs_stages[] = { &m_data_fs, &m_data_gs, &m_data_tc, &m_data_te, &m_data_vs };
	const unsigned int n_cs_stages	= sizeof(cs_stages) / sizeof(cs_stages[0]);
	const unsigned int n_noncs_stages = sizeof(noncs_stages) / sizeof(noncs_stages[0]);

	const glw::GLuint programs[] = {
		m_po_noncs_id, m_po_cs_id,
	};
	const unsigned int n_programs = sizeof(programs) / sizeof(programs[0]);

	/* Set up rounding for the tests */
	deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);

	for (unsigned int n_program = 0; n_program < n_programs; ++n_program)
	{
		glw::GLuint   po_id		 = programs[n_program];
		unsigned int  n_stages   = 0;
		_stage_data** stage_data = DE_NULL;

		if (po_id == m_po_cs_id)
		{
			n_stages   = n_cs_stages;
			stage_data = cs_stages;
		}
		else
		{
			n_stages   = n_noncs_stages;
			stage_data = noncs_stages;
		}

		/* Skip compute shader program if not supported */
		if (0 == po_id)
		{
			continue;
		}

		for (unsigned int n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Iterate through all uniforms */
			_stage_data* stage_ptr = stage_data[n_stage];

			/* Set up arrays that we will guide the automated testing */
			const uniform_value_pair double_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_double, &stage_ptr->uniforms.uniform_double),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_double_arr[0],
								   stage_ptr->uniforms.uniform_double_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_double_arr[1],
								   stage_ptr->uniforms.uniform_double_arr + 1),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_double,
								   &stage_ptr->uniform_structure_arrays[0].uniform_double),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_double,
								   &stage_ptr->uniform_structure_arrays[1].uniform_double)
			};
			const uniform_value_pair dvec2_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec2, stage_ptr->uniforms.uniform_dvec2),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec2_arr[0],
								   stage_ptr->uniforms.uniform_dvec2_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec2_arr[1],
								   stage_ptr->uniforms.uniform_dvec2_arr + 2),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec2,
								   stage_ptr->uniform_structure_arrays[0].uniform_dvec2),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec2,
								   stage_ptr->uniform_structure_arrays[1].uniform_dvec2)
			};
			const uniform_value_pair dvec3_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec3, stage_ptr->uniforms.uniform_dvec3),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec3_arr[0],
								   stage_ptr->uniforms.uniform_dvec3_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec3_arr[1],
								   stage_ptr->uniforms.uniform_dvec3_arr + 3),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec3,
								   stage_ptr->uniform_structure_arrays[0].uniform_dvec3),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec3,
								   stage_ptr->uniform_structure_arrays[1].uniform_dvec3)
			};
			const uniform_value_pair dvec4_uniforms[] = {
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec4, stage_ptr->uniforms.uniform_dvec4),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec4_arr[0],
								   stage_ptr->uniforms.uniform_dvec4_arr + 0),
				uniform_value_pair(stage_ptr->uniforms.uniform_location_dvec4_arr[1],
								   stage_ptr->uniforms.uniform_dvec4_arr + 4),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[0].uniform_location_dvec4,
								   stage_ptr->uniform_structure_arrays[0].uniform_dvec4),
				uniform_value_pair(stage_ptr->uniform_structure_arrays[1].uniform_location_dvec4,
								   stage_ptr->uniform_structure_arrays[1].uniform_dvec4)
			};

			/* Iterate over all uniforms and verify the values reported by the API */
			double		 returned_double_data[4];
			float		 returned_float_data[4];
			int			 returned_int_data[4];
			unsigned int returned_uint_data[4];

			for (unsigned int n_type = 0; n_type < 4 /* double/dvec2/dvec3/dvec4 */; ++n_type)
			{
				const uniform_value_pair* current_uv_pairs  = NULL;
				const unsigned int		  n_components_used = n_type + 1; /* n_type=0: double, n_type=1: dvec2, etc.. */
				unsigned int			  n_pairs			= 0;

				switch (n_type)
				{
				case 0: /* double */
				{
					current_uv_pairs = double_uniforms;
					n_pairs			 = sizeof(double_uniforms) / sizeof(double_uniforms[0]);

					break;
				}

				case 1: /* dvec2 */
				{
					current_uv_pairs = dvec2_uniforms;
					n_pairs			 = sizeof(dvec2_uniforms) / sizeof(dvec2_uniforms[0]);

					break;
				}

				case 2: /* dvec3 */
				{
					current_uv_pairs = dvec3_uniforms;
					n_pairs			 = sizeof(dvec3_uniforms) / sizeof(dvec3_uniforms[0]);

					break;
				}

				case 3: /* dvec4 */
				{
					current_uv_pairs = dvec4_uniforms;
					n_pairs			 = sizeof(dvec4_uniforms) / sizeof(dvec4_uniforms[0]);

					break;
				}

				default:
				{
					TCU_FAIL("Invalid type index requested");
				}
				} /* switch (n_type) */

				for (unsigned int n_pair = 0; n_pair < n_pairs; ++n_pair)
				{
					const uniform_value_pair& current_uv_pair  = current_uv_pairs[n_pair];
					glw::GLint				  uniform_location = current_uv_pair.first;
					const double*			  uniform_value	= current_uv_pair.second;

					/* Retrieve the values from the GL implementation*/
					gl.getUniformdv(po_id, uniform_location, returned_double_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformdv() call failed.");

					gl.getUniformfv(po_id, uniform_location, returned_float_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformfv() call failed.");

					gl.getUniformiv(po_id, uniform_location, returned_int_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformiv() call failed.");

					gl.getUniformuiv(po_id, uniform_location, returned_uint_data);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformuiv() call failed.");

					/* Make sure the values reported match the reference values */
					bool		can_continue = true;
					const float epsilon		 = 1e-5f;

					for (unsigned int n_component = 0; n_component < n_components_used && can_continue; ++n_component)
					{
						if (de::abs(returned_double_data[n_component] - uniform_value[n_component]) > epsilon)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformdv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_double_data[n_component] << "]"
																		", expected:["
								<< uniform_value[n_component] << "]" << tcu::TestLog::EndMessage;

							result = false;
						}

						if (de::abs(returned_float_data[n_component] - uniform_value[n_component]) > epsilon)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformfv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_float_data[n_component] << "]"
																	   ", expected:["
								<< uniform_value[n_component] << "]" << tcu::TestLog::EndMessage;

							result = false;
						}

						/* ints */
						int rounded_uniform_value_sint = (int)(deFloatRound((float)uniform_value[n_component]));
						unsigned int rounded_uniform_value_uint =
							(unsigned int)(uniform_value[n_component] > 0.0) ?
								((unsigned int)deFloatRound((float)uniform_value[n_component])) :
								0;

						if (returned_int_data[n_component] != rounded_uniform_value_sint)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformiv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_int_data[n_component] << "]"
																	 ", expected:["
								<< rounded_uniform_value_sint << "]" << tcu::TestLog::EndMessage;

							result = false;
						}

						if (returned_uint_data[n_component] != rounded_uniform_value_uint)
						{
							m_testCtx.getLog()
								<< tcu::TestLog::Message
								<< "Invalid uniform value reported by glGetUniformuiv() for uniform location ["
								<< uniform_location << "]"
													   " and component ["
								<< n_component << "]"
												  ": retrieved:["
								<< returned_uint_data[n_component] << "]"
																	  ", expected:["
								<< rounded_uniform_value_uint << "]" << tcu::TestLog::EndMessage;

							result = false;
						}
					} /* for (all components) */
				}	 /* for (all uniform+value pairs) */
			}		  /* for (all 4 uniform types) */
		}			  /* for (all shader stages) */
	}				  /* for (both program objects) */

	/* All done! */
	return result;
}